

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

uint64_t __thiscall helics::FederateState::getQueueSize(FederateState *this)

{
  bool bVar1;
  const_iterator __lhs;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *end_point;
  const_iterator __end1;
  const_iterator __begin1;
  shared_handle *__range1;
  uint64_t cnt;
  undefined4 in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
  local_38;
  undefined1 local_30 [24];
  undefined1 *local_18;
  uint64_t local_10;
  
  local_10 = 0;
  InterfaceInfo::getEndpoints_abi_cxx11_
            ((InterfaceInfo *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_18 = local_30;
  local_38._M_current =
       (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
       gmlc::libguarded::
       shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
       ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  __lhs = gmlc::libguarded::
          shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                      ((__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator*(&local_38);
    std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::operator->
              ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
               0x577ebe);
    in_stack_ffffffffffffff8c = EndpointInfo::availableMessages((EndpointInfo *)0x577ec6);
    local_10 = (long)in_stack_ffffffffffffff8c + local_10;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
    ::operator++(&local_38);
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              *)0x577e89);
  return local_10;
}

Assistant:

uint64_t FederateState::getQueueSize() const
{
    uint64_t cnt = 0;
    for (const auto& end_point : interfaceInformation.getEndpoints()) {
        cnt += end_point->availableMessages();
    }
    return cnt;
}